

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O1

size_t google::protobuf::internal::MapKeyDataOnlyByteSize(FieldDescriptor *field,MapKey *value)

{
  CppType CVar1;
  long lVar2;
  CppType CVar3;
  uint32_t uVar4;
  int32_t iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  int64_t iVar9;
  ulong uVar10;
  Nonnull<const_char_*> pcVar11;
  string_view sVar12;
  LogMessage LStack_28;
  
  CVar1 = *(CppType *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4);
  CVar3 = MapKey::type(value);
  if (CVar1 == CVar3) {
    pcVar11 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar11 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                        ((ulong)CVar1,(ulong)CVar3,
                         "FieldDescriptor::TypeToCppType(field->type()) == value.type()");
  }
  if (pcVar11 != (Nonnull<const_char_*>)0x0) {
    MapKeyDataOnlyByteSize();
    goto LAB_00274c69;
  }
  switch(field->type_) {
  case '\x01':
  case '\x02':
  case '\n':
  case '\v':
  case '\f':
  case '\x0e':
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x607);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_28,(char (*) [12])"Unsupported");
    goto LAB_00274c69;
  case '\x03':
    uVar10 = MapKey::GetInt64Value(value);
    goto LAB_00274bdb;
  case '\x04':
    uVar10 = MapKey::GetUInt64Value(value);
    goto LAB_00274bdb;
  case '\x05':
    uVar6 = MapKey::GetInt32Value(value);
    uVar10 = (ulong)(int)(uVar6 | 1);
    goto LAB_00274bdf;
  case '\x06':
  case '\x10':
    sVar8 = 8;
    break;
  case '\a':
  case '\x0f':
    sVar8 = 4;
    break;
  case '\b':
    sVar8 = 1;
    break;
  case '\t':
    sVar12 = MapKey::GetStringValue(value);
    uVar6 = (uint)sVar12._M_len | 1;
    iVar7 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    sVar8 = (ulong)(iVar7 * 9 + 0x49U >> 6) + sVar12._M_len;
    break;
  case '\r':
    uVar4 = MapKey::GetUInt32Value(value);
    iVar7 = 0x1f;
    if ((uVar4 | 1) != 0) {
      for (; (uVar4 | 1) >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    goto LAB_00274be3;
  case '\x11':
    iVar5 = MapKey::GetInt32Value(value);
    uVar6 = iVar5 >> 0x1f ^ iVar5 * 2 | 1;
    iVar7 = 0x1f;
    if (uVar6 != 0) {
      for (; uVar6 >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    goto LAB_00274be3;
  case '\x12':
    iVar9 = MapKey::GetInt64Value(value);
    uVar10 = iVar9 >> 0x3f ^ iVar9 * 2;
LAB_00274bdb:
    uVar10 = uVar10 | 1;
LAB_00274bdf:
    lVar2 = 0x3f;
    if (uVar10 != 0) {
      for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    iVar7 = (int)lVar2;
LAB_00274be3:
    sVar8 = (size_t)(iVar7 * 9 + 0x49U >> 6);
    break;
  default:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&LStack_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/wire_format.cc"
               ,0x622);
    absl::lts_20250127::log_internal::LogMessage::operator<<
              (&LStack_28,(char (*) [16])"Cannot get here");
LAB_00274c69:
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&LStack_28);
  }
  return sVar8;
}

Assistant:

size_t MapKeyDataOnlyByteSize(const FieldDescriptor* field,
                              const MapKey& value) {
  ABSL_DCHECK_EQ(FieldDescriptor::TypeToCppType(field->type()), value.type());
  switch (field->type()) {
    case FieldDescriptor::TYPE_DOUBLE:
    case FieldDescriptor::TYPE_FLOAT:
    case FieldDescriptor::TYPE_GROUP:
    case FieldDescriptor::TYPE_MESSAGE:
    case FieldDescriptor::TYPE_BYTES:
    case FieldDescriptor::TYPE_ENUM:
      ABSL_LOG(FATAL) << "Unsupported";
      return 0;
#define CASE_TYPE(FieldType, CamelFieldType, CamelCppType) \
  case FieldDescriptor::TYPE_##FieldType:                  \
    return WireFormatLite::CamelFieldType##Size(           \
        value.Get##CamelCppType##Value());

#define FIXED_CASE_TYPE(FieldType, CamelFieldType) \
  case FieldDescriptor::TYPE_##FieldType:          \
    return WireFormatLite::k##CamelFieldType##Size;

      CASE_TYPE(INT32, Int32, Int32);
      CASE_TYPE(INT64, Int64, Int64);
      CASE_TYPE(UINT32, UInt32, UInt32);
      CASE_TYPE(UINT64, UInt64, UInt64);
      CASE_TYPE(SINT32, SInt32, Int32);
      CASE_TYPE(SINT64, SInt64, Int64);
      CASE_TYPE(STRING, String, String);
      FIXED_CASE_TYPE(FIXED32, Fixed32);
      FIXED_CASE_TYPE(FIXED64, Fixed64);
      FIXED_CASE_TYPE(SFIXED32, SFixed32);
      FIXED_CASE_TYPE(SFIXED64, SFixed64);
      FIXED_CASE_TYPE(BOOL, Bool);

#undef CASE_TYPE
#undef FIXED_CASE_TYPE
  }
  ABSL_LOG(FATAL) << "Cannot get here";
  return 0;
}